

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *data_ptr,
               char *format)

{
  float fVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  float arg1f;
  float arg0f;
  int arg1i;
  int data_backup [2];
  undefined8 local_68;
  double local_60;
  double *local_58;
  float local_4c;
  char *local_48;
  size_t local_40;
  undefined1 local_38 [8];
  
  while( true ) {
    bVar3 = *buf;
    uVar4 = (ulong)bVar3;
    if (0x2f < uVar4) break;
    if ((0x100000200U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x8c0000000000U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_0014355e;
      break;
    }
    buf = (char *)((byte *)buf + 1);
  }
  bVar3 = 0;
LAB_00143574:
  if (*buf == 0) {
LAB_001437bb:
    bVar5 = false;
  }
  else {
    local_40 = GDataTypeInfo[data_type].Size;
    local_58 = (double *)data_ptr;
    local_48 = initial_value_buf;
    memcpy(local_38,data_ptr,local_40);
    if (format == (char *)0x0) {
      format = GDataTypeInfo[data_type].ScanFmt;
    }
    local_4c = 0.0;
    if (data_type == 0) {
      local_60 = (double)CONCAT44(local_60._4_4_,*(float *)local_58);
      local_68 = (double)((ulong)local_68._4_4_ << 0x20);
      if (bVar3 == 0) {
LAB_00143712:
        iVar2 = __isoc99_sscanf(buf,format,&local_4c);
        fVar1 = local_4c;
        if (iVar2 == 1) {
LAB_00143839:
          *(float *)local_58 = fVar1;
        }
      }
      else {
        iVar2 = __isoc99_sscanf(local_48,format,&local_60);
        if (iVar2 < 1) goto LAB_001437bb;
        if (bVar3 == 0x2a) {
          iVar2 = __isoc99_sscanf(buf,"%f",&local_68);
          if (iVar2 != 0) {
            fVar1 = (float)(int)((float)(int)local_60._0_4_ * (float)local_68);
            goto LAB_00143839;
          }
        }
        else if (bVar3 == 0x2f) {
          iVar2 = __isoc99_sscanf(buf,"%f",&local_68);
          if (iVar2 != 0) {
            if (((float)local_68 != 0.0) || (NAN((float)local_68))) {
              fVar1 = (float)(int)((float)(int)local_60._0_4_ / (float)local_68);
              goto LAB_00143839;
            }
          }
        }
        else {
          if (bVar3 != 0x2b) goto LAB_00143712;
          iVar2 = __isoc99_sscanf(buf,"%d",&local_4c);
          if (iVar2 != 0) {
            fVar1 = (float)((int)local_4c + (int)local_60._0_4_);
            goto LAB_00143839;
          }
        }
      }
    }
    else if ((uint)data_type < 4) {
      __isoc99_sscanf(buf,format);
    }
    else if (data_type == 5) {
      local_60 = *local_58;
      local_68 = 0.0;
      if (((bVar3 != 0) && (iVar2 = __isoc99_sscanf(local_48,"%lf",&local_60), iVar2 < 1)) ||
         (iVar2 = __isoc99_sscanf(buf,"%lf",&local_68), iVar2 < 1)) goto LAB_001437bb;
      if (bVar3 == 0x2a) {
        dVar6 = local_60 * local_68;
      }
      else if (bVar3 == 0x2f) {
        if ((local_68 == 0.0) && (!NAN(local_68))) goto LAB_001438b7;
        dVar6 = local_60 / local_68;
      }
      else {
        dVar6 = local_68;
        if (bVar3 == 0x2b) {
          dVar6 = local_60 + local_68;
        }
      }
      *local_58 = dVar6;
    }
    else if (data_type == 4) {
      local_60 = (double)CONCAT44(local_60._4_4_,*(float *)local_58);
      local_68 = (double)((ulong)local_68._4_4_ << 0x20);
      if (((bVar3 != 0) && (iVar2 = __isoc99_sscanf(local_48,"%f",&local_60), iVar2 < 1)) ||
         (iVar2 = __isoc99_sscanf(buf,"%f",&local_68), iVar2 < 1)) goto LAB_001437bb;
      if (bVar3 == 0x2a) {
        fVar1 = local_60._0_4_ * (float)local_68;
      }
      else if (bVar3 == 0x2f) {
        if (((float)local_68 == 0.0) && (!NAN((float)local_68))) goto LAB_001438b7;
        fVar1 = local_60._0_4_ / (float)local_68;
      }
      else {
        fVar1 = (float)local_68;
        if (bVar3 == 0x2b) {
          fVar1 = local_60._0_4_ + (float)local_68;
        }
      }
      *(float *)local_58 = fVar1;
    }
LAB_001438b7:
    iVar2 = bcmp(local_38,local_58,local_40);
    bVar5 = iVar2 != 0;
  }
  return bVar5;
LAB_0014355e:
  do {
    do {
      buf = (char *)((byte *)buf + 1);
    } while (*buf == 0x20);
  } while (*buf == 9);
  goto LAB_00143574;
}

Assistant:

static bool DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* data_ptr, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsBlankA(*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    IM_ASSERT(data_type < ImGuiDataType_COUNT);
    int data_backup[2];
    IM_ASSERT(GDataTypeInfo[data_type].Size <= sizeof(data_backup));
    memcpy(data_backup, data_ptr, GDataTypeInfo[data_type].Size);

    if (format == NULL)
        format = GDataTypeInfo[data_type].ScanFmt;

    int arg1i = 0;
    if (data_type == ImGuiDataType_S32)
    {
        int* v = (int*)data_ptr;
        int arg0i = *v;
        float arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, format, &arg1i) == 1) *v = arg1i; }                           // Assign constant
    }
    else if (data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
    {
        // Assign constant
        // FIXME: We don't bother handling support for legacy operators since they are a little too crappy. Instead we may implement a proper expression evaluator in the future.
        sscanf(buf, format, data_ptr);
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        format = "%f";
        float* v = (float*)data_ptr;
        float arg0f = *v, arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)data_ptr;
        double arg0f = *v, arg1f = 0.0;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    return memcmp(data_backup, data_ptr, GDataTypeInfo[data_type].Size) != 0;
}